

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_merge_inplace(char *file1,char *file2)

{
  uint uVar1;
  uint64_t nparticles;
  long lVar2;
  long lVar3;
  int iVar4;
  mcpl_file_t ff1;
  mcpl_file_t ff2;
  FILE *__stream;
  mcpl_fileinternal_t *f_1;
  mcpl_fileinternal_t *f;
  mcu8str file2_str;
  mcu8str file1_str;
  mcu8str local_60;
  mcu8str local_48;
  
  mcu8str_view_cstr(&local_48,file1);
  mcu8str_view_cstr(&local_60,file2);
  iVar4 = mctools_is_same_file(&local_48,&local_60);
  if (iVar4 != 0) {
    mcpl_error("Merging file with itself");
  }
  ff1 = mcpl_open_file(file1);
  ff2 = mcpl_open_file(file2);
  iVar4 = mcpl_actual_can_merge(ff1,ff2);
  if (iVar4 == 0) {
    mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff1.internal);
    mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
    mcpl_error("Attempting to merge incompatible files");
  }
  if (*(int *)((long)ff1.internal + 0x18) != *(int *)((long)ff2.internal + 0x18)) {
    mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff1.internal);
    mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
    mcpl_error(
              "Attempting to merge incompatible files (can not mix MCPL format versions when merging inplace)"
              );
  }
  if (*(long *)((long)ff1.internal + 8) == 0) {
    nparticles = *(uint64_t *)((long)ff2.internal + 0x40);
    if (nparticles == 0) {
      mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff1.internal);
      mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
    }
    else {
      uVar1 = *(uint *)((long)ff1.internal + 0x78);
      if ((uVar1 != *(uint *)((long)ff2.internal + 0x78)) ||
         (lVar2 = *(long *)((long)ff1.internal + 0x80),
         lVar2 != *(long *)((long)ff2.internal + 0x80))) {
        mcpl_error("mcpl_merge_inplace: unexpected particle size or position");
      }
      lVar3 = *(long *)((long)ff1.internal + 0x40);
      mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff1.internal);
      __stream = (FILE *)mcpl_internal_fopen(file1,"r+b");
      if (__stream == (FILE *)0x0) {
        mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
        mcpl_error("Unable to open file1 in update mode!");
      }
      iVar4 = fseek(__stream,(ulong)uVar1 * lVar3 + lVar2,0);
      if (iVar4 != 0) {
        mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
        fclose(__stream);
        mcpl_error("Unable to seek to end of file1 in update mode");
      }
      mcpl_update_nparticles((FILE *)__stream,0);
      mcpl_transfer_particle_contents((FILE *)__stream,ff2,nparticles);
      mcpl_update_nparticles((FILE *)__stream,lVar3 + nparticles);
      mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
      fclose(__stream);
    }
    return;
  }
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff1.internal);
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)ff2.internal);
  mcpl_error("direct modification of gzipped files is not supported.");
}

Assistant:

void mcpl_merge_inplace(const char * file1, const char* file2)
{
  {
    mcu8str file1_str = mcu8str_view_cstr( file1 );
    mcu8str file2_str = mcu8str_view_cstr( file2 );
    if ( mctools_is_same_file(&file1_str, &file2_str) )
      mcpl_error("Merging file with itself");
  }

  mcpl_file_t ff1 = mcpl_open_file(file1);
  mcpl_file_t ff2 = mcpl_open_file(file2);
  int can_merge = mcpl_actual_can_merge(ff1,ff2);
  if (!can_merge) {
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    mcpl_error("Attempting to merge incompatible files");
  }

  //Access internals:
  mcpl_fileinternal_t * f1 = (mcpl_fileinternal_t *)ff1.internal;
  mcpl_fileinternal_t * f2 = (mcpl_fileinternal_t *)ff2.internal;
  assert(f1);
  assert(f2);

  if (f1->format_version!=f2->format_version) {
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    mcpl_error("Attempting to merge incompatible files (can not mix"
               " MCPL format versions when merging inplace)");
  }

  if (f1->filegz) {
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    mcpl_error("direct modification of gzipped files is not supported.");
  }

  uint64_t np1 = f1->nparticles;
  uint64_t np2 = f2->nparticles;
  if (!np2) {
    //nothing to take from file 2.
    mcpl_close_file(ff1);
    mcpl_close_file(ff2);
    return;
  }

  unsigned particle_size = f1->particle_size;
  uint64_t first_particle_pos = f1->first_particle_pos;

  //Should be same since can_merge:
  if ( particle_size != f2->particle_size
       || first_particle_pos != f2->first_particle_pos )
    mcpl_error("mcpl_merge_inplace: unexpected particle size or position");

  //Now, close file1 and reopen a file handle in append mode:
  mcpl_close_file(ff1);
  FILE * f1a = mcpl_internal_fopen(file1,"r+b");

  //Update file positions. Note that f2->file is already at the position for the
  //first particle and that the seek operation on f1a correctly discards any
  //partial entries at the end, which could be there if the file was in need of
  //mcpl_repair:
  if (!f1a) {
    mcpl_close_file(ff2);
    mcpl_error("Unable to open file1 in update mode!");
  }
  if (MCPL_FSEEK( f1a, first_particle_pos + particle_size*np1 )) {
    mcpl_close_file(ff2);
    fclose(f1a);
    mcpl_error("Unable to seek to end of file1 in update mode");
  }

  //Transfer particle contents, setting nparticles to 0 during the operation (so
  //the file appears broken and in need of mcpl_repair in case of errors during
  //the transfer):
  mcpl_update_nparticles(f1a,0);
  mcpl_transfer_particle_contents(f1a, ff2, np2);
  mcpl_update_nparticles(f1a,np1+np2);

  //Finish up.
  mcpl_close_file(ff2);
  fclose(f1a);
}